

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::InfoCollector::visitArrayFill(InfoCollector *this,ArrayFill *curr)

{
  bool bVar1;
  Module *wasm;
  ArraySet *curr_00;
  ArraySet *set;
  Builder builder;
  ArrayFill *curr_local;
  InfoCollector *this_local;
  
  builder.wasm._4_4_ = 1;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)78>).super_Expression.
                      type,(BasicType *)((long)&builder.wasm + 4));
  if (!bVar1) {
    wasm = Walker<wasm::(anonymous_namespace)::InfoCollector,_wasm::OverriddenVisitor<wasm::(anonymous_namespace)::InfoCollector,_void>_>
           ::getModule((Walker<wasm::(anonymous_namespace)::InfoCollector,_wasm::OverriddenVisitor<wasm::(anonymous_namespace)::InfoCollector,_void>_>
                        *)this);
    Builder::Builder((Builder *)&set,wasm);
    curr_00 = Builder::makeArraySet((Builder *)&set,curr->ref,curr->index,curr->value);
    visitArraySet(this,curr_00);
  }
  return;
}

Assistant:

void visitArrayFill(ArrayFill* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }
    // See ArrayCopy, above.
    Builder builder(*getModule());
    auto* set = builder.makeArraySet(curr->ref, curr->index, curr->value);
    visitArraySet(set);
  }